

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::doit(aalcalc *this,string *subfolder)

{
  aalcalc *paVar1;
  bool bVar2;
  uint uVar3;
  FILE *pFVar4;
  char *pcVar5;
  size_t sVar6;
  _Alloc_hider _Var7;
  pointer pp_Var8;
  int iVar9;
  summarySampleslevelHeader *sh;
  int iVar10;
  FILE *__stream;
  int local_112c;
  int period_no;
  uint local_1124;
  int local_1120;
  int summary_id;
  aalcalc *local_1118;
  int file_index;
  vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> filehandles;
  string path;
  string s;
  string filename;
  longlong file_offset;
  sampleslevelRec sr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filelist;
  FILE *in;
  char line [4096];
  
  std::operator+(&path,"work/",subfolder);
  std::__cxx11::string::substr((ulong)line,(ulong)&path);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)line,
                          "/");
  std::__cxx11::string::~string((string *)line);
  if (bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)line,&path,
                   "/");
    std::__cxx11::string::operator=((string *)&path,(string *)line);
    std::__cxx11::string::~string((string *)line);
  }
  loadoccurrence(this);
  summaryindex::doit(&path,&this->event_to_period_);
  initsamplesize(this,&path);
  getmaxsummaryid(this,&path);
  getsamplesizes(this);
  loadperiodtoweighting(this);
  loadensemblemapping(this);
  filename._M_dataplus._M_p = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->vec_sample_sum_loss_,(long)this->samplesize_ + 1,
             (value_type_conflict2 *)&filename);
  std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>::resize
            (&this->vec_ensemble_aal_,(long)this->max_ensemble_id_ * (long)this->max_summary_id_ + 1
            );
  std::vector<aal_rec,_std::allocator<aal_rec>_>::resize
            (&this->vec_analytical_aal_,(long)this->max_summary_id_ + 1);
  filelist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filelist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filelist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&filename,&path,"filelist.idx");
  local_1118 = this;
  pFVar4 = fopen(filename._M_dataplus._M_p,"rb");
  _Var7 = filename._M_dataplus;
  if (pFVar4 != (FILE *)0x0) {
    while (pcVar5 = fgets(line,0x1000,pFVar4), pcVar5 != (char *)0x0) {
      pcVar5 = strchr(line,10);
      if (pcVar5 != (char *)0x0) {
        *pcVar5 = '\0';
      }
      std::__cxx11::string::string((string *)&s,line,(allocator *)&in);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,&path,
                     &s);
      std::__cxx11::string::operator=((string *)&filename,(string *)&in);
      std::__cxx11::string::~string((string *)&in);
      in = (FILE *)fopen(filename._M_dataplus._M_p,"rb");
      _Var7 = s._M_dataplus;
      if ((FILE *)in == (FILE *)0x0) goto LAB_001038f2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&filelist,&s);
      std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::push_back
                (&filehandles,(value_type *)&in);
      std::__cxx11::string::~string((string *)&s);
    }
    fclose(pFVar4);
    std::operator+(&s,&path,"summaries.idx");
    std::__cxx11::string::operator=((string *)&filename,(string *)&s);
    std::__cxx11::string::~string((string *)&s);
    pFVar4 = fopen(filename._M_dataplus._M_p,"rb");
    _Var7 = filename._M_dataplus;
    if (pFVar4 != (FILE *)0x0) {
      local_1124 = 1;
      local_1120 = -1;
      iVar10 = -1;
      __stream = (FILE *)0x0;
      local_112c = local_1120;
      while( true ) {
        pcVar5 = fgets(line,0x1000,pFVar4);
        if (pcVar5 == (char *)0x0) {
          fclose(pFVar4);
          paVar1 = local_1118;
          local_1118->current_summary_id_ = iVar10;
          if (iVar10 != -1) {
            do_calc_end(local_1118,local_112c);
          }
          outputresultscsv_new(paVar1);
          for (pp_Var8 = filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              pp_Var8 !=
              filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
              super__Vector_impl_data._M_finish; pp_Var8 = pp_Var8 + 1) {
            fclose((FILE *)*pp_Var8);
          }
          if (pp_Var8 !=
              filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
          }
          std::__cxx11::string::~string((string *)&filename);
          std::_Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::~_Vector_base
                    (&filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&filelist);
          std::__cxx11::string::~string((string *)&path);
          return;
        }
        uVar3 = __isoc99_sscanf(line,"%d, %d, %d, %lld",&summary_id,&file_index,&period_no,
                                &file_offset);
        paVar1 = local_1118;
        if (uVar3 != 4) break;
        if (iVar10 == summary_id) {
          iVar9 = local_112c;
          if ((local_112c != period_no) && (iVar9 = period_no, local_112c != -1)) {
            do_calc_end(local_1118,local_112c);
            iVar9 = period_no;
          }
        }
        else {
          if (iVar10 != -1) {
            do_calc_end(local_1118,local_112c);
          }
          paVar1->current_summary_id_ = summary_id;
          iVar9 = period_no;
          iVar10 = summary_id;
        }
        if (local_1120 != file_index) {
          __stream = (FILE *)filehandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[file_index];
          local_1120 = file_index;
        }
        if (__stream == (FILE *)0x0) {
          fwrite("FATAL:File handle is a nullptr",0x1e,1,_stderr);
          goto LAB_00103950;
        }
        s._M_dataplus._M_p = (pointer)0x0;
        s._M_string_length = 0;
        s.field_2._M_allocated_capacity = 0;
        fseek(__stream,file_offset,0);
        sh = (summarySampleslevelHeader *)0xc;
        sVar6 = fread(&in,0xc,1,__stream);
        while (((sVar6 != 0 &&
                (sh = (summarySampleslevelHeader *)0x8,
                sVar6 = fread((summarySampleslevelHeader *)&sr,8,1,__stream), sVar6 != 0)) &&
               (sr.sidx != 0))) {
          if (1 < sr.sidx + 5U) {
            sh = (summarySampleslevelHeader *)&sr;
            std::vector<sampleslevelRec,_std::allocator<sampleslevelRec>_>::push_back
                      ((vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&s,
                       (value_type *)&sr);
          }
        }
        do_calc_by_period(local_1118,sh,
                          (vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&s);
        std::_Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>::~_Vector_base
                  ((_Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&s);
        local_1124 = local_1124 + 1;
        local_112c = iVar9;
      }
      fprintf(_stderr,"FATAL:Invalid data in line %d:\n%s %d",(ulong)local_1124,line,(ulong)uVar3);
      iVar10 = -1;
      goto LAB_00103952;
    }
  }
LAB_001038f2:
  fprintf(_stderr,"FATAL:%s: cannot open %s\n","doit",_Var7._M_p);
LAB_00103950:
  iVar10 = 1;
LAB_00103952:
  exit(iVar10);
}

Assistant:

void aalcalc::doit(const std::string& subfolder)
{
	std::string path = "work/" + subfolder;
	if (path.substr(path.length() - 1, 1) != "/") {
		path = path + "/";
	}
	loadoccurrence();
	summaryindex::doit(path, event_to_period_);
	initsamplesize(path);
	getmaxsummaryid(path);
	getsamplesizes();
	loadperiodtoweighting();
	loadensemblemapping();
	char line[4096];
	vec_sample_sum_loss_.resize(samplesize_+1, 0.0);
	vec_ensemble_aal_.resize(max_summary_id_ * max_ensemble_id_ + 1);
	vec_analytical_aal_.resize(max_summary_id_ + 1);
	std::vector<std::string> filelist;
	std::vector<FILE *> filehandles;
	std::string filename = path + "filelist.idx";
	FILE* fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}
	
	while (fgets(line, sizeof(line), fin) != 0) {
		char *pos;
		if ((pos = strchr(line, '\n')) != NULL) *pos = '\0';   // remove newline from buffer		
		std::string s = line;
		filename = path + s;
		FILE* in = fopen(filename.c_str(), "rb");
		if (in == NULL) {
			fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, s.c_str());
			exit(EXIT_FAILURE);
		}
		filelist.push_back(s);
		filehandles.push_back(in);
	}

	fclose(fin);

	int lineno = 1;
	filename = path + "summaries.idx";
	fin = fopen(filename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL:%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	int summary_id;
	int file_index;
	int period_no;
	long long file_offset;
	int last_summary_id = -1;
	int last_period_no = -1;
	int last_file_index = -1;
	FILE* summary_fin = nullptr;
	while (fgets(line, sizeof(line), fin) != 0)
	{
		int ret = sscanf(line, "%d, %d, %d, %lld", &summary_id,
				&file_index, &period_no, &file_offset);
		if (ret != 4) {
			fprintf(stderr, "FATAL:Invalid data in line %d:\n%s %d",
				lineno, line, ret);
			exit(-1);
		}
		else
		{
			if (last_summary_id != summary_id) {
				if (last_summary_id != -1) {
					do_calc_end(last_period_no);
				}
				last_period_no = -1;   // Reset
				current_summary_id_ = summary_id;
				last_summary_id = summary_id;
			}
			if (last_period_no != period_no) {
				if (last_period_no != -1) {
					do_calc_end(last_period_no);
				}
				last_period_no = period_no;
			}
			
			if (last_file_index != file_index) {
				last_file_index = file_index;
				summary_fin = filehandles[file_index];
			}
			if (summary_fin != nullptr) {
				std::vector<sampleslevelRec> vrec;
				flseek(summary_fin, file_offset, SEEK_SET);
				summarySampleslevelHeader sh;
				size_t i = fread(&sh, sizeof(sh), 1, summary_fin);
				while (i != 0) {
					sampleslevelRec sr;
					i = fread(&sr, sizeof(sr), 1, summary_fin);
					if (i == 0 || sr.sidx == 0) break;
					if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) continue;
					vrec.push_back(sr);
				}
				do_calc_by_period(sh, vrec);
			}else {
				fprintf(stderr, "FATAL:File handle is a nullptr");
				exit(EXIT_FAILURE);
			}

		}
		lineno++;
	}

	fclose(fin);
	current_summary_id_ = last_summary_id;
	if (last_summary_id != -1) do_calc_end(last_period_no);

	outputresultscsv_new();
	auto iter = filehandles.begin();
	while (iter != filehandles.end()) {
		fclose(*iter);
		iter++;
	}
	filehandles.clear();
}